

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O3

void ddSuppInteract(DdNode *f,int *support)

{
  DdNode *pDVar1;
  
  if (((ulong)f->index != 0x7fffffff) &&
     ((undefined1  [16])((undefined1  [16])f->type & (undefined1  [16])0x1) == (undefined1  [16])0x0
     )) {
    support[f->index] = 1;
    ddSuppInteract((f->type).kids.T,support);
    ddSuppInteract((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe),support);
    pDVar1 = (f->type).kids.T;
    f->next = (DdNode *)((ulong)f->next | 1);
    (f->type).kids.T = (DdNode *)((ulong)pDVar1 | 1);
  }
  return;
}

Assistant:

static void
ddSuppInteract(
  DdNode * f,
  int * support)
{
    if (cuddIsConstant(f) || Cudd_IsComplement(cuddT(f))) {
        return;
    }

    support[f->index] = 1;
    ddSuppInteract(cuddT(f),support);
    ddSuppInteract(Cudd_Regular(cuddE(f)),support);
    /* mark as visited */
    cuddT(f) = Cudd_Complement(cuddT(f));
    f->next = Cudd_Complement(f->next);
    return;

}